

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::Expect(WastParser *this,TokenType type)

{
  Location loc;
  bool bVar1;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  string local_80;
  Token token;
  
  bVar1 = Match(this,type);
  if (!bVar1) {
    Consume(&token,this);
    Token::to_string_clamp_abi_cxx11_(&local_80,&token,0x50);
    pcVar2 = GetTokenTypeName(type);
    uStack_a0 = (undefined4)token.loc.filename.size_;
    uStack_9c = (undefined4)(token.loc.filename.size_ >> 0x20);
    local_98 = token.loc.field_1._0_4_;
    uStack_94 = token.loc.field_1._4_4_;
    uStack_90 = (undefined4)token.loc.field_1._8_8_;
    uStack_8c = (undefined4)((ulong)token.loc.field_1._8_8_ >> 0x20);
    loc.filename.size_._0_4_ = uStack_a0;
    loc.filename.data_ = token.loc.filename.data_;
    loc.filename.size_._4_4_ = uStack_9c;
    loc.field_1.field_0.line = local_98;
    loc.field_1.field_0.first_column = uStack_94;
    loc.field_1.field_0.last_column = uStack_90;
    loc.field_1._12_4_ = uStack_8c;
    Error(this,loc,"unexpected token %s, expected %s.",local_80._M_dataplus._M_p,pcVar2,in_R8,in_R9)
    ;
    std::__cxx11::string::_M_dispose();
  }
  return (Result)(uint)!bVar1;
}

Assistant:

Result WastParser::Expect(TokenType type) {
  if (!Match(type)) {
    Token token = Consume();
    Error(token.loc, "unexpected token %s, expected %s.",
          token.to_string_clamp(kMaxErrorTokenLength).c_str(),
          GetTokenTypeName(type));
    return Result::Error;
  }

  return Result::Ok;
}